

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

DataChunk * __thiscall duckdb::StringValueResult::ToChunk(StringValueResult *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (-1 < this->number_of_rows) {
    (this->parse_chunk).count = this->number_of_rows;
    return &this->parse_chunk;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "CSVScanner: ToChunk() function. Has a negative number of rows, this indicates an issue with the error handler."
             ,&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DataChunk &StringValueResult::ToChunk() {
	if (number_of_rows < 0) {
		throw InternalException("CSVScanner: ToChunk() function. Has a negative number of rows, this indicates an "
		                        "issue with the error handler.");
	}
	parse_chunk.SetCardinality(static_cast<idx_t>(number_of_rows));
	return parse_chunk;
}